

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

MemChunk * __thiscall
cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::splitChunk
          (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this,MemChunk *chunk,
          size_type size)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = chunk->m_size & 0xfffffffffffffff0;
  uVar2 = uVar1 - size;
  if (0x1f < uVar2) {
    chunk->m_size = size;
    *(size_type *)((long)&chunk->m_prevFootSize + size) = size;
    *(ulong *)((long)&chunk->m_size + size) = uVar2;
    *(ulong *)((long)&chunk->m_prevFootSize + uVar1) = uVar2;
    addChunk(this,(MemChunk *)((long)&chunk->m_prevFootSize + size));
  }
  return chunk;
}

Assistant:

inline MemChunk*
    splitChunk (MemChunk* chunk, size_type size)
    {
        // the size of the 2nd half after the split
        size_type remainSize = chunk->getChunkSize () - size;

        if (remainSize >= MIN_CHUNK_SIZE)
        {
            MemChunk* remainChunk = (MemChunk*)((char*)chunk + size);

            chunk->setFreeChunkSize (size);

            remainChunk->setFreeChunkSize (remainSize);

            addChunk (remainChunk);
        }
        return chunk;
    }